

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

int __thiscall QFormLayout::heightForWidth(QFormLayout *this,int width)

{
  QFormLayoutPrivate *this_00;
  char cVar1;
  QFormLayoutPrivate *dat;
  int iVar2;
  long in_FS_OFFSET;
  int bottomMargin;
  int rightMargin;
  int topMargin;
  int leftMargin;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  cVar1 = (**(code **)(*(long *)&this->super_QLayout + 0xf8))();
  iVar2 = -1;
  if (cVar1 != '\0') {
    local_34 = -0x55555556;
    local_38 = -0x55555556;
    local_3c = -0x55555556;
    local_40 = -0x55555556;
    QLayout::getContentsMargins(&this->super_QLayout,&local_34,&local_38,&local_3c,&local_40);
    iVar2 = width - (local_34 + local_3c);
    if ((this_00->hfw_width != iVar2) &&
       ((this_00->sh_width != iVar2 || (this_00->hfw_sh_height < 0)))) {
      QFormLayoutPrivate::setupVerticalLayoutData(this_00,iVar2);
      QFormLayoutPrivate::setupHorizontalLayoutData(this_00,iVar2);
      QFormLayoutPrivate::recalcHFW(this_00,iVar2);
    }
    iVar2 = local_38 + (&this_00->hfw_height)[iVar2 == this_00->sh_width] + local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFormLayout::heightForWidth(int width) const
{
    Q_D(const QFormLayout);
    if (!hasHeightForWidth())
        return -1;

    int leftMargin, topMargin, rightMargin, bottomMargin;
    getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    int targetWidth = width - leftMargin - rightMargin;

    if (!d->haveHfwCached(targetWidth)) {
        QFormLayoutPrivate *dat = const_cast<QFormLayoutPrivate *>(d);
        dat->setupVerticalLayoutData(targetWidth);
        dat->setupHorizontalLayoutData(targetWidth);
        dat->recalcHFW(targetWidth);
    }
    if (targetWidth == d->sh_width)
        return d->hfw_sh_height + topMargin + bottomMargin;
    else
        return d->hfw_height + topMargin + bottomMargin;
}